

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

AActor * P_SpawnMissileXYZ(DVector3 *pos,AActor *source,AActor *dest,PClassActor *type,
                          bool checkspawn,AActor *owner)

{
  double dVar1;
  double dVar2;
  char *pcVar3;
  BYTE BVar4;
  bool bVar5;
  int iVar6;
  AActor *missile;
  PClass *pPVar7;
  double dVar8;
  double dVar9;
  DVector3 velocity;
  TVector3<double> local_48;
  
  if (source != (AActor *)0x0) {
    if (dest == (AActor *)0x0) {
      pcVar3 = FName::NameData.NameArray
               [(type->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text;
      pPVar7 = DObject::GetClass((DObject *)source);
      Printf("P_SpawnMissilyXYZ: Tried to shoot %s from %s with no dest\n",pcVar3,
             FName::NameData.NameArray[(pPVar7->super_PStruct).super_PNamedType.TypeName.Index].Text
            );
      return (AActor *)0x0;
    }
    dVar1 = pos->Z;
    if (((dVar1 != -2147483648.0) || (NAN(dVar1))) && ((dVar1 != 2147483647.0 || (NAN(dVar1))))) {
      pos->Z = dVar1 - source->Floorclip;
    }
    missile = Spawn(type,pos,ALLOW_REPLACE);
    P_PlaySpawnSound(missile,source);
    if (owner == (AActor *)0x0) {
      owner = source;
    }
    (missile->target).field_0.p = owner;
    dVar1 = missile->Speed;
    AActor::Vec3To(&velocity,source,dest);
    if (((missile->flags3).Value & 3) == 0) {
      dVar2 = (source->__Pos).Z;
      if (dest->Height <= pos->Z - dVar2) {
        velocity.Z = dVar2 + (dest->Height - pos->Z) + velocity.Z;
      }
    }
    else {
      velocity.Z = 0.0;
    }
    TVector3<double>::Resized(&local_48,&velocity,dVar1);
    (missile->Vel).Z = local_48.Z;
    (missile->Vel).X = local_48.X;
    (missile->Vel).Y = local_48.Y;
    if ((((dest->flags).Value & 0x40000) != 0) && (((source->flags6).Value & 0x1000000) == 0)) {
      iVar6 = FRandom::Random2(&pr_spawnmissile);
      dVar8 = fastcosdeg((double)iVar6 * 0.087890625);
      dVar9 = fastsindeg((double)iVar6 * 0.087890625);
      dVar1 = (missile->Vel).X;
      dVar2 = (missile->Vel).Y;
      (missile->Vel).X = dVar8 * dVar1 - dVar2 * dVar9;
      (missile->Vel).Y = dVar8 * dVar2 + dVar1 * dVar9;
    }
    AActor::AngleFromVel(missile);
    if (((missile->flags4).Value & 0x40000) != 0) {
      if (owner->player == (player_t *)0x0) {
        BVar4 = '\0';
      }
      else {
        BVar4 = (char)((long)(owner->player[-0x3b4b].frags + 7) / 0x2a0) + '\x01';
      }
      missile->FriendPlayer = BVar4;
    }
    if (!checkspawn) {
      return missile;
    }
    bVar5 = P_CheckMissileSpawn(missile,source->radius);
    if (bVar5) {
      return missile;
    }
  }
  return (AActor *)0x0;
}

Assistant:

AActor *P_SpawnMissileXYZ (DVector3 pos, AActor *source, AActor *dest, PClassActor *type, bool checkspawn, AActor *owner)
{
	if (source == NULL)
	{
		return NULL;
	}

	if (dest == NULL)
	{
		Printf ("P_SpawnMissilyXYZ: Tried to shoot %s from %s with no dest\n",
			type->TypeName.GetChars(), source->GetClass()->TypeName.GetChars());
		return NULL;
	}

	if (pos.Z != ONFLOORZ && pos.Z != ONCEILINGZ)
	{
		pos.Z -= source->Floorclip;
	}

	AActor *th = Spawn (type, pos, ALLOW_REPLACE);
	
	P_PlaySpawnSound(th, source);

	// record missile's originator
	if (owner == NULL) owner = source;
	th->target = owner;

	double speed = th->Speed;

	// [RH]
	// Hexen calculates the missile velocity based on the source's location.
	// Would it be more useful to base it on the actual position of the
	// missile?
	// Answer: No, because this way, you can set up sets of parallel missiles.

	DVector3 velocity = source->Vec3To(dest);
	// Floor and ceiling huggers should never have a vertical component to their velocity
	if (th->flags3 & (MF3_FLOORHUGGER|MF3_CEILINGHUGGER))
	{
		velocity.Z = 0;
	}
	// [RH] Adjust the trajectory if the missile will go over the target's head.
	else if (pos.Z - source->Z() >= dest->Height)
	{
		velocity.Z += (dest->Height - pos.Z + source->Z());
	}
	th->Vel = velocity.Resized(speed);

	// invisible target: rotate velocity vector in 2D
	// [RC] Now monsters can aim at invisible player as if they were fully visible.
	if (dest->flags & MF_SHADOW && !(source->flags6 & MF6_SEEINVISIBLE))
	{
		DAngle an = pr_spawnmissile.Random2() * (22.5 / 256);
		double c = an.Cos();
		double s = an.Sin();
		
		double newx = th->Vel.X * c - th->Vel.Y * s;
		double newy = th->Vel.X * s + th->Vel.Y * c;

		th->Vel.X = newx;
		th->Vel.Y = newy;
	}

	th->AngleFromVel();

	if (th->flags4 & MF4_SPECTRAL)
	{
		th->SetFriendPlayer(owner->player);
	}

	return (!checkspawn || P_CheckMissileSpawn (th, source->radius)) ? th : NULL;
}